

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O3

int __thiscall
amrex::distFcnElement2d::solve_thomas
          (distFcnElement2d *this,vector<double,_std::allocator<double>_> *a,
          vector<double,_std::allocator<double>_> *b,vector<double,_std::allocator<double>_> *c,
          vector<double,_std::allocator<double>_> *d,vector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  uVar6 = (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar5 = (uint)uVar6;
  std::vector<double,_std::allocator<double>_>::resize(x,uVar6 & 0xffffffff);
  pdVar1 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (1 < uVar5) {
    pdVar3 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      dVar10 = -pdVar3[lVar8] / pdVar2[lVar8];
      pdVar2[lVar8 + 1] = pdVar4[lVar8] * dVar10 + pdVar2[lVar8 + 1];
      pdVar1[lVar8 + 1] = dVar10 * pdVar1[lVar8] + pdVar1[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while ((uVar6 & 0xffffffff) - 1 != lVar8);
  }
  uVar7 = uVar5 - 1;
  pdVar3 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[uVar7] = pdVar1[uVar7] / pdVar2[uVar7];
  if (-1 < (int)(uVar5 - 2)) {
    pdVar4 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (ulong)(uVar5 - 2);
    dVar10 = pdVar3[uVar6 + 1];
    do {
      dVar10 = (pdVar1[uVar6] - dVar10 * pdVar4[uVar6]) / pdVar2[uVar6];
      pdVar3[uVar6] = dVar10;
      bVar9 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar9);
  }
  return 0;
}

Assistant:

int distFcnElement2d::solve_thomas(const std::vector<amrex::Real> &a,
                                   std::vector<amrex::Real> b,
                                   const std::vector<amrex::Real> &c,
                                   std::vector<amrex::Real> d,
                                   std::vector<amrex::Real> &x) {
  unsigned n;
  n = d.size();
  x.resize(n);

  amrex::Real m;
  for (unsigned i=1; i < n; ++i) {
    m = a[i-1]/b[i-1];
    b[i] -= m*c[i-1];
    d[i] -= m*d[i-1];
  }

  x[n-1] = d[n-1] / b[n-1];

  for (int i=n-2; i > -1; --i) {
    x[i] = (d[i]-c[i]*x[i+1])/b[i];
  }

  return 0;
}